

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemMakeWriteable(Mem *pMem)

{
  undefined2 uVar1;
  ushort uVar2;
  int iVar3;
  
  uVar2 = pMem->flags;
  if ((uVar2 & 0x12) != 0) {
    if (((uVar2 >> 0xe & 1) != 0) && (iVar3 = sqlite3VdbeMemExpandBlob(pMem), iVar3 != 0)) {
      return 7;
    }
    if ((pMem->szMalloc == 0) || (pMem->z != pMem->zMalloc)) {
      iVar3 = sqlite3VdbeMemGrow(pMem,pMem->n + 2,1);
      if (iVar3 != 0) {
        return 7;
      }
      pMem->z[pMem->n] = '\0';
      pMem->z[(long)pMem->n + 1] = '\0';
      uVar1 = pMem->flags;
      uVar2 = uVar1 | 0x200;
    }
    else {
      uVar2 = pMem->flags;
    }
  }
  pMem->flags = uVar2 & 0xefff;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemMakeWriteable(Mem *pMem){
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( (pMem->flags&MEM_RowSet)==0 );
  if( (pMem->flags & (MEM_Str|MEM_Blob))!=0 ){
    if( ExpandBlob(pMem) ) return SQLITE_NOMEM;
    if( pMem->szMalloc==0 || pMem->z!=pMem->zMalloc ){
      if( sqlite3VdbeMemGrow(pMem, pMem->n + 2, 1) ){
        return SQLITE_NOMEM_BKPT;
      }
      pMem->z[pMem->n] = 0;
      pMem->z[pMem->n+1] = 0;
      pMem->flags |= MEM_Term;
    }
  }
  pMem->flags &= ~MEM_Ephem;
#ifdef SQLITE_DEBUG
  pMem->pScopyFrom = 0;
#endif

  return SQLITE_OK;
}